

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

void __thiscall Kvm::addBindingToFrame(Kvm *this,Value *var,Value *val,Value *frame)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  _func_int **pp_Var2;
  ValueType VVar3;
  uint uVar4;
  Value *result;
  Value *local_38;
  
  local_38 = (Value *)0x0;
  this_00 = &this->gc_;
  Kgc::pushLocalStackRoot(this_00,&local_38);
  pp_Var2 = frame[1]._vptr_Value;
  local_38 = Kgc::allocValue(this_00,CELL);
  local_38[1]._vptr_Value = (_func_int **)var;
  *(_func_int ***)&local_38[1].type_ = pp_Var2;
  set_car(frame,local_38);
  VVar3 = frame[1].type_;
  uVar4 = frame[1].marked_;
  local_38 = Kgc::allocValue(this_00,CELL);
  local_38[1]._vptr_Value = (_func_int **)val;
  local_38[1].type_ = VVar3;
  local_38[1].marked_ = uVar4;
  set_cdr(frame,local_38);
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return;
}

Assistant:

void Kvm::addBindingToFrame(const Value *var, const Value *val, const Value *frame)
{
    const Value *result = nullptr;
    gc_.pushLocalStackRoot(&result);
    
    result = makeCell(var, car(frame));
    set_car(const_cast<Value *>(frame), result);
    
    result = makeCell(val, cdr(frame));
    set_cdr(const_cast<Value *>(frame), result);
    
    gc_.popLocalStackRoot();
}